

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testCenter<double>(char *type)

{
  ostream *poVar1;
  char *in_RDI;
  double dVar2;
  double dVar3;
  Interval<double> b_1;
  double max;
  double min;
  Interval<double> b1;
  double p1;
  double p0;
  Interval<double> b0;
  Interval<double> b;
  Interval<double> IStack_78;
  double local_68;
  double local_60;
  Interval<double> local_58;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  Interval<double> local_28;
  Interval<double> local_18;
  char *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar1 = std::operator<<(poVar1,local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x16eca2);
  dVar2 = Imath_3_2::Interval<double>::center(&local_18);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("b.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x204,"void (anonymous namespace)::testCenter(const char *) [T = double]");
  }
  local_30 = -1.0;
  local_38 = 1.0;
  Imath_3_2::Interval<double>::Interval(&local_28,&local_30,&local_38);
  dVar2 = Imath_3_2::Interval<double>::center(&local_28);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("b0.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x20c,"void (anonymous namespace)::testCenter(const char *) [T = double]");
  }
  local_40 = 1.0;
  local_48 = 2.0;
  Imath_3_2::Interval<double>::Interval(&local_58,&local_40,&local_48);
  dVar2 = Imath_3_2::Interval<double>::center(&local_58);
  dVar3 = (local_48 + local_40) / 2.0;
  if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
    __assert_fail("b1.center () == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x212,"void (anonymous namespace)::testCenter(const char *) [T = double]");
  }
  local_60 = 0.0;
  local_68 = 2.0;
  Imath_3_2::Interval<double>::Interval(&IStack_78,&local_60,&local_68);
  dVar2 = Imath_3_2::Interval<double>::center(&IStack_78);
  if ((dVar2 == local_68 / 2.0) && (!NAN(dVar2) && !NAN(local_68 / 2.0))) {
    return;
  }
  __assert_fail("b.center () == max / 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x21e,"void (anonymous namespace)::testCenter(const char *) [T = double]");
}

Assistant:

void
testCenter (const char* type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (b.center () == T (0));
    }

    //
    // Center of non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.center () == T (0));

        T p0 (1);
        T p1 (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (b1.center () == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);

        assert (b.center () == max / 2);
    }
}